

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGRULayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  string *psVar6;
  uint64 uVar7;
  uint uVar8;
  bool bVar9;
  WeightParamType *wt;
  LayerUnion LVar10;
  WeightParams *pWVar11;
  pointer pWVar12;
  long lVar13;
  long *plVar14;
  size_type *psVar15;
  WeightParamType WVar16;
  uint64_t uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  InternalMetadataWithArenaLite *pIVar21;
  long lVar22;
  bool bVar23;
  Result r;
  string err;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypeList;
  size_type *local_120;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  char local_f1;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> local_88;
  LayerUnion local_68;
  uint64 local_60;
  uint64_t local_58;
  string local_50;
  
  Result::Result((Result *)&local_120);
  validateInputCount((Result *)local_b0,layer,1,2);
  local_120 = (size_type *)local_b0;
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
  pcVar2 = local_a0 + 8;
  if (local_a8._M_p != pcVar2) {
    operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
  }
  bVar9 = Result::good((Result *)&local_120);
  if (bVar9) {
    validateOutputCount((Result *)local_b0,layer,2,2);
    local_120 = (size_type *)local_b0;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
    if (local_a8._M_p != pcVar2) {
      operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
    }
  }
  bVar9 = Result::good((Result *)&local_120);
  if ((bVar9) && (bVar9 = Result::good((Result *)&local_120), bVar9)) {
    if (this->ndArrayInterpretation != true) {
LAB_002d2387:
      if (layer->_oneof_case_[0] == 0x19a) {
        LVar10 = layer->layer_;
      }
      else {
        LVar10.gru_ = Specification::GRULayerParams::default_instance();
      }
      local_f1 = (LVar10.gru_)->hasbiasvectors_;
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start = (WeightParamType *)0x0;
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (WeightParamType *)0x0;
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (WeightParamType *)0x0;
      pWVar11 = (LVar10.batchnorm_)->variance_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar18 = (pWVar11->floatvalue_).current_size_;
      sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
      uVar20 = (0 < iVar18) + 1;
      if (sVar3 == 0) {
        uVar20 = (uint)(0 < iVar18);
      }
      sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
      sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar5 == 0);
      uVar20 = (uVar20 - (sVar4 == 0)) + 2;
      local_b0._0_4_ = UNSPECIFIED;
      if (uVar20 - uVar8 < 2) {
        local_b0._0_4_ = EMPTY;
        if (uVar20 != uVar8) {
          local_b0._0_4_ = (uint)(iVar18 < 1);
        }
        if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
            (((sVar4 == 0 ||
              (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (local_b0._0_4_ = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar5 == 0 ||
             (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (local_b0._0_4_ = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
          local_b0._0_4_ = EMPTY;
        }
      }
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_88,(iterator)0x0,(WeightParamType *)local_b0);
      pWVar11 = (LVar10.scale_)->scale_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar18 = (pWVar11->floatvalue_).current_size_;
      sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
      uVar20 = (0 < iVar18) + 1;
      if (sVar3 == 0) {
        uVar20 = (uint)(0 < iVar18);
      }
      sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
      sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar5 == 0);
      uVar20 = (uVar20 - (sVar4 == 0)) + 2;
      local_b0._0_4_ = UNSPECIFIED;
      if (uVar20 - uVar8 < 2) {
        local_b0._0_4_ = EMPTY;
        if (uVar20 != uVar8) {
          local_b0._0_4_ = (uint)(iVar18 < 1);
        }
        if ((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
           ((((sVar4 == 0 ||
              (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (local_b0._0_4_ = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)) &&
            (((sVar5 == 0 ||
              (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (local_b0._0_4_ = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))))) {
          local_b0._0_4_ = EMPTY;
        }
      }
      if (local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        _M_realloc_insert<CoreML::WeightParamType>
                  (&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
      }
      else {
        *local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
        local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pWVar11 = (LVar10.gru_)->resetgateweightmatrix_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar18 = (pWVar11->floatvalue_).current_size_;
      sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
      uVar20 = (0 < iVar18) + 1;
      if (sVar3 == 0) {
        uVar20 = (uint)(0 < iVar18);
      }
      sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
      sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar5 == 0);
      uVar20 = (uVar20 - (sVar4 == 0)) + 2;
      local_b0._0_4_ = UNSPECIFIED;
      if (uVar20 - uVar8 < 2) {
        local_b0._0_4_ = EMPTY;
        if (uVar20 != uVar8) {
          local_b0._0_4_ = (uint)(iVar18 < 1);
        }
        if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
            (((sVar4 == 0 ||
              (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (local_b0._0_4_ = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar5 == 0 ||
             (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (local_b0._0_4_ = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
          local_b0._0_4_ = EMPTY;
        }
      }
      if (local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        _M_realloc_insert<CoreML::WeightParamType>
                  (&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
      }
      else {
        *local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
        local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pWVar11 = (LVar10.scale_)->bias_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar18 = (pWVar11->floatvalue_).current_size_;
      sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
      uVar20 = (0 < iVar18) + 1;
      if (sVar3 == 0) {
        uVar20 = (uint)(0 < iVar18);
      }
      sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
      sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar5 == 0);
      uVar20 = (uVar20 - (sVar4 == 0)) + 2;
      local_b0._0_4_ = UNSPECIFIED;
      if (uVar20 - uVar8 < 2) {
        local_b0._0_4_ = EMPTY;
        if (uVar20 != uVar8) {
          local_b0._0_4_ = (uint)(iVar18 < 1);
        }
        if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
            (((sVar4 == 0 ||
              (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (local_b0._0_4_ = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar5 == 0 ||
             (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (local_b0._0_4_ = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
          local_b0._0_4_ = EMPTY;
        }
      }
      if (local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        _M_realloc_insert<CoreML::WeightParamType>
                  (&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
      }
      else {
        *local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
        local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pWVar11 = (LVar10.gru_)->outputgateweightmatrix_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar18 = (pWVar11->floatvalue_).current_size_;
      sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
      uVar20 = (0 < iVar18) + 1;
      if (sVar3 == 0) {
        uVar20 = (uint)(0 < iVar18);
      }
      sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
      sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar5 == 0);
      uVar20 = (uVar20 - (sVar4 == 0)) + 2;
      local_b0._0_4_ = UNSPECIFIED;
      if (uVar20 - uVar8 < 2) {
        local_b0._0_4_ = EMPTY;
        if (uVar20 != uVar8) {
          local_b0._0_4_ = (uint)(iVar18 < 1);
        }
        if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
            (((sVar4 == 0 ||
              (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (local_b0._0_4_ = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar5 == 0 ||
             (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (local_b0._0_4_ = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
          local_b0._0_4_ = EMPTY;
        }
      }
      if (local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        _M_realloc_insert<CoreML::WeightParamType>
                  (&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
      }
      else {
        *local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
        local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pWVar11 = (LVar10.gru_)->outputgaterecursionmatrix_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar18 = (pWVar11->floatvalue_).current_size_;
      sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
      uVar20 = (0 < iVar18) + 1;
      if (sVar3 == 0) {
        uVar20 = (uint)(0 < iVar18);
      }
      sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
      sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar5 == 0);
      uVar20 = (uVar20 - (sVar4 == 0)) + 2;
      local_b0._0_4_ = UNSPECIFIED;
      if (uVar20 - uVar8 < 2) {
        local_b0._0_4_ = EMPTY;
        if (uVar20 != uVar8) {
          local_b0._0_4_ = (uint)(iVar18 < 1);
        }
        if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
            (((sVar4 == 0 ||
              (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (local_b0._0_4_ = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar5 == 0 ||
             (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (local_b0._0_4_ = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
          local_b0._0_4_ = EMPTY;
        }
      }
      if (local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        _M_realloc_insert<CoreML::WeightParamType>
                  (&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
      }
      else {
        *local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
        local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (local_f1 != '\0') {
        pWVar11 = (LVar10.gru_)->updategatebiasvector_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar18 = (pWVar11->floatvalue_).current_size_;
        sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar20 = (0 < iVar18) + 1;
        if (sVar3 == 0) {
          uVar20 = (uint)(0 < iVar18);
        }
        sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
        sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
        uVar8 = (uint)(sVar5 == 0);
        uVar20 = (uVar20 - (sVar4 == 0)) + 2;
        WVar16 = UNSPECIFIED;
        if (uVar20 - uVar8 < 2) {
          WVar16 = EMPTY;
          if (uVar20 != uVar8) {
            WVar16 = (uint)(iVar18 < 1);
          }
          if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
              (((sVar4 == 0 ||
                (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (WVar16 = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar5 == 0 ||
               (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
              (WVar16 = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
            WVar16 = EMPTY;
          }
        }
        if (local_88.
            super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_b0._0_4_ = WVar16;
          std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
          _M_realloc_insert<CoreML::WeightParamType>
                    (&local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
        }
        else {
          *local_88.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish = WVar16;
          local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pWVar11 = (LVar10.gru_)->resetgatebiasvector_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar18 = (pWVar11->floatvalue_).current_size_;
        sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar20 = (0 < iVar18) + 1;
        if (sVar3 == 0) {
          uVar20 = (uint)(0 < iVar18);
        }
        sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
        sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
        uVar8 = (uint)(sVar5 == 0);
        uVar20 = (uVar20 - (sVar4 == 0)) + 2;
        local_b0._0_4_ = UNSPECIFIED;
        if (uVar20 - uVar8 < 2) {
          local_b0._0_4_ = EMPTY;
          if (uVar20 != uVar8) {
            local_b0._0_4_ = (uint)(iVar18 < 1);
          }
          if ((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
             ((((sVar4 == 0 ||
                (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (local_b0._0_4_ = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)) &&
              (((sVar5 == 0 ||
                (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (local_b0._0_4_ = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))))) {
            local_b0._0_4_ = EMPTY;
          }
        }
        if (local_88.
            super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
          _M_realloc_insert<CoreML::WeightParamType>
                    (&local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
        }
        else {
          *local_88.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
          local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pWVar11 = (LVar10.gru_)->outputgatebiasvector_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar18 = (pWVar11->floatvalue_).current_size_;
        sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar20 = (0 < iVar18) + 1;
        if (sVar3 == 0) {
          uVar20 = (uint)(0 < iVar18);
        }
        sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
        sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
        uVar8 = (uint)(sVar5 == 0);
        uVar20 = (uVar20 - (sVar4 == 0)) + 2;
        local_b0._0_4_ = UNSPECIFIED;
        if (uVar20 - uVar8 < 2) {
          local_b0._0_4_ = EMPTY;
          if (uVar20 != uVar8) {
            local_b0._0_4_ = (uint)(iVar18 < 1);
          }
          if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar20 != uVar8)) &&
              (((sVar4 == 0 ||
                (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (local_b0._0_4_ = QUINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar5 == 0 ||
               (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
              (local_b0._0_4_ = QINT, pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
            local_b0._0_4_ = EMPTY;
          }
        }
        if (local_88.
            super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
          _M_realloc_insert<CoreML::WeightParamType>
                    (&local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
        }
        else {
          *local_88.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
          local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      bVar9 = local_88.
              super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_88.
              super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      if (!bVar9) {
        iVar18 = 0;
        iVar19 = 0;
        pWVar12 = local_88.
                  super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (*pWVar12 == FLOAT16) {
            iVar19 = iVar19 + 1;
          }
          else if (*pWVar12 == FLOAT32) {
            iVar18 = iVar18 + 1;
          }
          if (0 < iVar18 * iVar19) break;
          pWVar12 = pWVar12 + 1;
          bVar9 = pWVar12 ==
                  local_88.
                  super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        } while (!bVar9);
      }
      if (bVar9) {
        local_60 = (LVar10.gru_)->outputvectorsize_;
        pWVar11 = (LVar10.batchnorm_)->variance_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        uVar17 = (LVar10.gru_)->inputvectorsize_ * local_60;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        local_68 = LVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
        psVar6 = (layer->name_).ptr_;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"update gate weight matrix","");
        validateGeneralWeightParams
                  ((Result *)local_b0,pWVar11,uVar17,local_60,&local_f0,psVar6,&local_d0);
        local_120 = (size_type *)local_b0;
        std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
        if (local_a8._M_p != local_a0 + 8) {
          operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
        }
        LVar10 = local_68;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        bVar9 = Result::good((Result *)&local_120);
        if (bVar9) {
          pWVar11 = (LVar10.gru_)->resetgateweightmatrix_;
          if (pWVar11 == (WeightParams *)0x0) {
            pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
          psVar6 = (layer->name_).ptr_;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"reset gate weight matrix","");
          validateGeneralWeightParams
                    ((Result *)local_b0,pWVar11,uVar17,local_60,&local_f0,psVar6,&local_d0);
          local_120 = (size_type *)local_b0;
          std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
          if (local_a8._M_p != local_a0 + 8) {
            operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
          }
          LVar10 = local_68;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          bVar9 = Result::good((Result *)&local_120);
          if (bVar9) {
            pWVar11 = (LVar10.gru_)->outputgateweightmatrix_;
            if (pWVar11 == (WeightParams *)0x0) {
              pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
            psVar6 = (layer->name_).ptr_;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"output gate weight matrix","");
            validateGeneralWeightParams
                      ((Result *)local_b0,pWVar11,uVar17,local_60,&local_f0,psVar6,&local_d0);
            local_120 = (size_type *)local_b0;
            std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
            if (local_a8._M_p != local_a0 + 8) {
              operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
            }
            LVar10 = local_68;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            bVar9 = Result::good((Result *)&local_120);
            if (bVar9) {
              pWVar11 = (LVar10.scale_)->scale_;
              if (pWVar11 == (WeightParams *)0x0) {
                pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              uVar7 = (LVar10.gru_)->outputvectorsize_;
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
              psVar6 = (layer->name_).ptr_;
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"update gate recursion matrix","");
              local_58 = uVar7 * uVar7;
              validateGeneralWeightParams
                        ((Result *)local_b0,pWVar11,local_58,local_60,&local_f0,psVar6,&local_d0);
              local_120 = (size_type *)local_b0;
              std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
              if (local_a8._M_p != local_a0 + 8) {
                operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
              }
              LVar10 = local_68;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar9 = Result::good((Result *)&local_120);
              if (bVar9) {
                pWVar11 = (LVar10.scale_)->bias_;
                if (pWVar11 == (WeightParams *)0x0) {
                  pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
                psVar6 = (layer->name_).ptr_;
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d0,"reset gate recursion matrix","");
                validateGeneralWeightParams
                          ((Result *)local_b0,pWVar11,local_58,local_60,&local_f0,psVar6,&local_d0);
                local_120 = (size_type *)local_b0;
                std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
                if (local_a8._M_p != local_a0 + 8) {
                  operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                }
                LVar10 = local_68;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                bVar9 = Result::good((Result *)&local_120);
                if (bVar9) {
                  pWVar11 = (LVar10.gru_)->outputgaterecursionmatrix_;
                  if (pWVar11 == (WeightParams *)0x0) {
                    pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
                  psVar6 = (layer->name_).ptr_;
                  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_d0,"output gate recursion matrix","");
                  validateGeneralWeightParams
                            ((Result *)local_b0,pWVar11,local_58,local_60,&local_f0,psVar6,&local_d0
                            );
                  local_120 = (size_type *)local_b0;
                  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
                  if (local_a8._M_p != local_a0 + 8) {
                    operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                  }
                  LVar10 = local_68;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                    operator_delete(local_d0._M_dataplus._M_p,
                                    local_d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                  }
                  bVar9 = Result::good((Result *)&local_120);
                  if (bVar9) {
                    if (local_f1 == '\0') {
LAB_002d36c6:
                      pIVar21 = &(LVar10.batchnorm_)->mean_->_internal_metadata_;
                      if ((LVar10.batchnorm_)->mean_ == (WeightParams *)0x0) {
                        pIVar21 = (InternalMetadataWithArenaLite *)0x0;
                      }
                      lVar13 = (long)(((RepeatedPtrField<CoreML::Specification::ActivationParams> *)
                                      &(LVar10.convolution_)->kernelsize_)->
                                     super_RepeatedPtrFieldBase).current_size_;
                      if (lVar13 != 0) {
                        lVar22 = 0;
                        do {
                          validateRecurrentActivationParams
                                    ((Result *)local_b0,
                                     *(ActivationParams **)
                                      ((long)&(pIVar21->
                                              super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                              ).ptr_ + lVar22));
                          local_120 = (size_type *)local_b0;
                          std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
                          if (local_a8._M_p != local_a0 + 8) {
                            operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                          }
                          bVar9 = Result::good((Result *)&local_120);
                          bVar23 = lVar13 * 8 + -8 != lVar22;
                          lVar22 = lVar22 + 8;
                        } while (bVar9 && bVar23);
                      }
                    }
                    else {
                      pWVar11 = (LVar10.gru_)->updategatebiasvector_;
                      if (pWVar11 == (WeightParams *)0x0) {
                        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                      }
                      uVar17 = (LVar10.gru_)->outputvectorsize_;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
                      psVar6 = (layer->name_).ptr_;
                      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_d0,"update gate bias vector","");
                      validateGeneralWeightParams
                                ((Result *)local_b0,pWVar11,uVar17,1,&local_f0,psVar6,&local_d0);
                      local_120 = (size_type *)local_b0;
                      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
                      if (local_a8._M_p != local_a0 + 8) {
                        operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                      }
                      LVar10 = local_68;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                        operator_delete(local_d0._M_dataplus._M_p,
                                        local_d0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      bVar9 = Result::good((Result *)&local_120);
                      if (bVar9) {
                        pWVar11 = (LVar10.gru_)->resetgatebiasvector_;
                        if (pWVar11 == (WeightParams *)0x0) {
                          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                        }
                        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_f0,"GRU","");
                        psVar6 = (layer->name_).ptr_;
                        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_d0,"reset gate bias vector","");
                        validateGeneralWeightParams
                                  ((Result *)local_b0,pWVar11,uVar17,1,&local_f0,psVar6,&local_d0);
                        local_120 = (size_type *)local_b0;
                        std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
                        if (local_a8._M_p != local_a0 + 8) {
                          operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                        }
                        LVar10 = local_68;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                          operator_delete(local_d0._M_dataplus._M_p,
                                          local_d0.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                          operator_delete(local_f0._M_dataplus._M_p,
                                          local_f0.field_2._M_allocated_capacity + 1);
                        }
                        bVar9 = Result::good((Result *)&local_120);
                        if (bVar9) {
                          pWVar11 = (LVar10.gru_)->outputgatebiasvector_;
                          if (pWVar11 == (WeightParams *)0x0) {
                            pWVar11 = (WeightParams *)
                                      &Specification::_WeightParams_default_instance_;
                          }
                          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_f0,"GRU","");
                          psVar6 = (layer->name_).ptr_;
                          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_d0,"output gate bias vector","");
                          validateGeneralWeightParams
                                    ((Result *)local_b0,pWVar11,uVar17,1,&local_f0,psVar6,&local_d0)
                          ;
                          local_120 = (size_type *)local_b0;
                          std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
                          if (local_a8._M_p != local_a0 + 8) {
                            operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                          }
                          LVar10 = local_68;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                            operator_delete(local_d0._M_dataplus._M_p,
                                            local_d0.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                            operator_delete(local_f0._M_dataplus._M_p,
                                            local_f0.field_2._M_allocated_capacity + 1);
                          }
                          bVar9 = Result::good((Result *)&local_120);
                          if (bVar9) goto LAB_002d36c6;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        *(size_type **)__return_storage_ptr__ = local_120;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_p == &local_108) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_108._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_118._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_110;
        local_110 = 0;
        local_108._M_local_buf[0] = '\0';
        local_118._M_p = (pointer)&local_108;
      }
      else {
        std::operator+(&local_f0,"GRU layer \'",(layer->name_).ptr_);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_f0);
        psVar15 = (size_type *)(plVar14 + 2);
        if ((size_type *)*plVar14 == psVar15) {
          local_a0._0_8_ = *psVar15;
          local_a0._8_8_ = plVar14[3];
          local_b0 = (undefined1  [8])local_a0;
        }
        else {
          local_a0._0_8_ = *psVar15;
          local_b0 = (undefined1  [8])*plVar14;
        }
        local_a8._M_p = (pointer)plVar14[1];
        *plVar14 = (long)psVar15;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b0);
        if (local_b0 != (undefined1  [8])local_a0) {
          operator_delete((void *)local_b0,local_a0._0_8_ + 1);
        }
      }
      if (local_88.
          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
          _M_impl.super__Vector_impl_data._M_start != (WeightParamType *)0x0) {
        operator_delete(local_88.
                        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_002d23f2;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GRU","");
    validateInputOutputRankEquality((Result *)local_b0,layer,&local_50,&this->blobNameToRank);
    local_120 = (size_type *)local_b0;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
    if (local_a8._M_p != pcVar2) {
      operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar9 = Result::good((Result *)&local_120);
    if (bVar9) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
      validateRankCount((Result *)local_b0,layer,&local_f0,5,5,&this->blobNameToRank);
      local_120 = (size_type *)local_b0;
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_a8);
      if (local_a8._M_p != pcVar2) {
        operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      bVar9 = Result::good((Result *)&local_120);
      if (bVar9) goto LAB_002d2387;
    }
  }
  *(size_type **)__return_storage_ptr__ = local_120;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p == &local_108) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_108._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_118._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_110;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_118._M_p = (pointer)&local_108;
LAB_002d23f2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGRULayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;

    // Must specify hidden states
    r = validateInputCount(layer, 1, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 2, 2);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "GRU", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "GRU", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.gru();
    bool hasBiasVectors = params.hasbiasvectors();

    std::vector<CoreML::WeightParamType> weightTypeList;
    weightTypeList.push_back(valueType(params.updategateweightmatrix()));
    weightTypeList.push_back(valueType(params.updategaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.resetgateweightmatrix()));
    weightTypeList.push_back(valueType(params.resetgaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.outputgateweightmatrix()));
    weightTypeList.push_back(valueType(params.outputgaterecursionmatrix()));
    if(hasBiasVectors){
        weightTypeList.push_back(valueType(params.updategatebiasvector()));
        weightTypeList.push_back(valueType(params.resetgatebiasvector()));
        weightTypeList.push_back(valueType(params.outputgatebiasvector()));
    }
    if(!isWeightParamTypeCompatible(weightTypeList)){
        const std::string err = "GRU layer '" + layer.name() + "' has invalid weight/recursion matrix or bias fields. "
        "Field value types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // allen-continue


    // Check the size of the input matrices
    const uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    const uint64_t outSize = params.outputvectorsize();
    r = validateGeneralWeightParams(params.updategateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "update gate weight matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.resetgateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "reset gate weight matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.outputgateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "output gate weight matrix");
    if (!r.good()) return r;

    // Check the size of the recurrent matrices
    const uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.updategaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "update gate recursion matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.resetgaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "reset gate recursion matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.outputgaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "output gate recursion matrix");
    if (!r.good()) return r;

    if (hasBiasVectors){
        const uint64_t bias_size = params.outputvectorsize();
        r = validateGeneralWeightParams(params.updategatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "update gate bias vector");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(params.resetgatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "reset gate bias vector");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(params.outputgatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "output gate bias vector");
        if (!r.good()) return r;
    }

    // Now check the activations
    for (const auto& activation : params.activations()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }
    return r;
}